

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

void hts_idx_destroy(hts_idx_t *idx)

{
  bidx_t *__ptr;
  byte bVar1;
  ulong uVar2;
  long lVar3;
  
  if (idx != (hts_idx_t *)0x0) {
    if (idx->fmt != 3) {
      for (lVar3 = 0; lVar3 < idx->m; lVar3 = lVar3 + 1) {
        __ptr = idx->bidx[lVar3];
        free(idx->lidx[lVar3].offset);
        if (__ptr != (bidx_t *)0x0) {
          bVar1 = 0;
          for (uVar2 = 0; (khint_t)uVar2 != __ptr->n_buckets; uVar2 = (ulong)((khint_t)uVar2 + 1)) {
            if ((__ptr->flags[uVar2 >> 4] >> (bVar1 & 0x1e) & 3) == 0) {
              free(__ptr->vals[uVar2].list);
            }
            bVar1 = bVar1 + 2;
          }
          free(__ptr->keys);
          free(__ptr->flags);
          free(__ptr->vals);
          free(__ptr);
        }
      }
      free(idx->bidx);
      free(idx->lidx);
      free(idx->meta);
    }
    free(idx);
    return;
  }
  return;
}

Assistant:

void hts_idx_destroy(hts_idx_t *idx)
{
    khint_t k;
    int i;
    if (idx == 0) return;
    // For HTS_FMT_CRAI, idx actually points to a different type -- see sam.c
    if (idx->fmt == HTS_FMT_CRAI) { free(idx); return; }

    for (i = 0; i < idx->m; ++i) {
        bidx_t *bidx = idx->bidx[i];
        free(idx->lidx[i].offset);
        if (bidx == 0) continue;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k)
            if (kh_exist(bidx, k))
                free(kh_value(bidx, k).list);
        kh_destroy(bin, bidx);
    }
    free(idx->bidx); free(idx->lidx); free(idx->meta);
    free(idx);
}